

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

Bac_Man_t * Bac_ManDupUserBoxes(Bac_Man_t *p)

{
  int iVar1;
  int iVar2;
  Bac_Man_t *pNew_00;
  Bac_Ntk_t *pBVar3;
  Bac_Ntk_t *pBVar4;
  Bac_Ntk_t *p_00;
  Bac_Man_t *pNew;
  int i;
  Bac_Ntk_t *pHost;
  Bac_Ntk_t *pNtk;
  Bac_Man_t *p_local;
  
  iVar1 = Bac_ManNtkNum(p);
  pNew_00 = Bac_ManStart(p,iVar1);
  for (pNew._4_4_ = 1; iVar1 = Bac_ManNtkNum(p), pNew._4_4_ <= iVar1; pNew._4_4_ = pNew._4_4_ + 1) {
    pBVar3 = Bac_ManNtk(p,pNew._4_4_);
    Bac_NtkSetCopy(pBVar3,pNew._4_4_);
  }
  for (pNew._4_4_ = 1; iVar1 = Bac_ManNtkNum(p), pNew._4_4_ <= iVar1; pNew._4_4_ = pNew._4_4_ + 1) {
    pBVar3 = Bac_ManNtk(p,pNew._4_4_);
    pBVar4 = Bac_NtkCopyNtk(pNew_00,pBVar3);
    Bac_NtkDupUserBoxes(pBVar4,pBVar3);
  }
  for (pNew._4_4_ = 1; iVar1 = Bac_ManNtkNum(p), pNew._4_4_ <= iVar1; pNew._4_4_ = pNew._4_4_ + 1) {
    pBVar3 = Bac_ManNtk(p,pNew._4_4_);
    pBVar4 = Bac_NtkHostNtk(pBVar3);
    if (pBVar4 != (Bac_Ntk_t *)0x0) {
      p_00 = Bac_NtkCopyNtk(pNew_00,pBVar3);
      iVar1 = Bac_NtkCopy(pBVar4);
      iVar2 = Bac_NtkHostObj(pBVar3);
      iVar2 = Bac_ObjCopy(pBVar4,iVar2);
      Bac_NtkSetHost(p_00,iVar1,iVar2);
    }
  }
  return pNew_00;
}

Assistant:

static inline Bac_Man_t * Bac_ManDupUserBoxes( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk, * pHost; int i;
    Bac_Man_t * pNew = Bac_ManStart( p, Bac_ManNtkNum(p) );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkSetCopy( pNtk, i );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkDupUserBoxes( Bac_NtkCopyNtk(pNew, pNtk), pNtk );
    Bac_ManForEachNtk( p, pNtk, i )
        if ( (pHost = Bac_NtkHostNtk(pNtk)) )
            Bac_NtkSetHost( Bac_NtkCopyNtk(pNew, pNtk), Bac_NtkCopy(pHost), Bac_ObjCopy(pHost, Bac_NtkHostObj(pNtk)) );
    return pNew;
}